

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adinput.c
# Opt level: O0

int set_diomask(uchar enable)

{
  int iVar1;
  size_t sVar2;
  char local_818 [8];
  char buf [2048];
  uint local_c;
  uchar enable_local;
  
  dio_num = 0;
  strcpy(local_818,"\n\n\n\n");
  sVar2 = strlen(local_818);
  serial_write(local_818,(int)sVar2);
  yp_usleep(50000);
  serial_flush_in();
  yp_usleep(50000);
  strcpy(local_818,"GETIO");
  if (enable == '\0') {
    strcat(local_818,"0");
  }
  else {
    strcat(local_818,"1");
    dio_num = dio_num + 1;
  }
  strcat(local_818,"\n");
  sVar2 = strlen(local_818);
  serial_write(local_818,(int)sVar2);
  local_818[0] = '\0';
  iVar1 = serial_recieve(admask_receive,local_818);
  local_c = (uint)(iVar1 == -1);
  return local_c;
}

Assistant:

int set_diomask(unsigned char enable)
{
  /* Send & Recive Buffer */
  char buf[2048];
  dio_num = 0;

  strcpy(buf, "\n\n\n\n");
  serial_write(buf, strlen(buf));
  yp_usleep(50000);
  serial_flush_in();
  yp_usleep(50000);
  strcpy(buf, "GETIO");
  if (enable)
  {
    strcat(buf, "1");
    dio_num++;
  }
  else
    strcat(buf, "0");
  strcat(buf, "\n");
  serial_write(buf, strlen(buf));

  buf[0] = 0;
  if (serial_recieve(admask_receive, buf) == -1)
    return 1;

  return 0;
}